

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O3

int anon_unknown.dwarf_4d6b97::makeUnixOpenFlags(uint oflag)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((oflag & 2) != 0) {
    uVar1 = (oflag & 1) + (oflag & 8) * 8 + 0x201 ^ 0x40;
    uVar2 = uVar1 & 0xff;
    if ((oflag & 0x20) != 0) {
      uVar1 = uVar2;
    }
    uVar2 = uVar2 | 0x400;
    if ((oflag & 4) == 0) {
      uVar2 = uVar1;
    }
  }
  uVar1 = uVar2 | 0xc0;
  if ((oflag & 0x10) == 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

int makeUnixOpenFlags(unsigned int oflag)
{
    int sysFlags = 0;
    if (oflag & File::ofRead)
        sysFlags = O_RDONLY;
    if (oflag & File::ofWrite)
    {
        if (oflag & File::ofRead)
            sysFlags = O_RDWR | O_TRUNC;
        else
            sysFlags = O_WRONLY | O_TRUNC;
        if (!(oflag & File::ofOpenExisting))
            sysFlags |= O_CREAT;
        if (oflag & File::ofNoTruncate)
        {
            sysFlags &= ~O_TRUNC;
        }
        if (oflag & File::ofAppend)
        {
            sysFlags |= O_APPEND;
            sysFlags &= ~O_TRUNC;
        }
    }
    if (oflag & File::ofCreateNew)
        sysFlags |= O_CREAT | O_EXCL;
    return sysFlags;
}